

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::asBool(Value *this)

{
  uint uVar1;
  bool bVar2;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  switch(*(undefined1 *)&this->bits_) {
  case 0:
    return false;
  case 1:
  case 2:
    bVar2 = (this->value_).int_ == 0;
    break;
  case 3:
    uVar1 = std::fpclassify((this->value_).real_);
    bVar2 = (uVar1 & 0xfffffffd) == 0;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::operator<<((ostream *)local_180,"Value is not convertible to bool.");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    return (this->value_).bool_;
  }
  return !bVar2;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}